

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::gestureEventHandler(QGraphicsScenePrivate *this,QGestureEvent *event)

{
  QObject *pQVar1;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *pQVar2;
  long lVar3;
  Data *pDVar4;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> QVar5;
  QGesture *this_00;
  undefined8 uVar6;
  undefined1 *puVar7;
  bool bVar8;
  bool bVar9;
  GestureState GVar10;
  GestureType GVar11;
  QFlags<Qt::GestureFlag> QVar12;
  GestureCancelPolicy GVar13;
  QWidget *pQVar14;
  QGraphicsView *this_01;
  QPoint QVar15;
  Node<QGesture_*,_QGraphicsObject_*> *pNVar16;
  iterator iVar17;
  iterator iVar18;
  ulong uVar19;
  QHash<QGesture_*,_QGraphicsObject_*> *this_02;
  Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *d;
  int *piVar20;
  Data *pDVar21;
  Node<QGesture_*,_QHashDummyValue> *pNVar22;
  QGraphicsItem *pQVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> QVar27;
  Data *pDVar28;
  ulong uVar29;
  ulong uVar30;
  qreal *pqVar31;
  QPointF *pQVar32;
  Data *pDVar33;
  int iVar34;
  long lVar35;
  char cVar36;
  QList<QGraphicsObject_*> *pQVar37;
  ulong uVar38;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar39;
  QHash<QGesture_*,_QHashDummyValue> QVar40;
  size_t sVar41;
  long in_FS_OFFSET;
  byte bVar42;
  QGraphicsObject **ppQVar43;
  piter it;
  QPointF QVar44;
  GestureType gestureType;
  QGraphicsObject *obj;
  QGesture *g_2;
  QGesture *g;
  QSet<QGesture_*> gestures;
  QGesture *gesture;
  QGestureEvent ev;
  QTransform toScene;
  int *local_210;
  GestureType local_1cc;
  Data *local_1c8;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> local_1c0;
  QHash<QGesture_*,_QHashDummyValue> local_1b8;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> local_1b0;
  QHash<QGesture_*,_QHashDummyValue> local_1a8;
  QHash<QGesture_*,_QHashDummyValue> local_1a0;
  QArrayData *local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  QHashDummyValue local_179;
  QTransform local_178;
  QArrayDataPointer<QGraphicsObject_*> local_128 [3];
  QTransform local_d8;
  QPointF local_88 [5];
  long local_38;
  
  bVar42 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = QGestureEvent::widget(event);
  if ((pQVar14 == (QWidget *)0x0) ||
     (this_01 = (QGraphicsView *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject),
     this_01 == (QGraphicsView *)0x0)) goto LAB_00608d1f;
  local_188 = &DAT_aaaaaaaaaaaaaaaa;
  local_198 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_190 = &DAT_aaaaaaaaaaaaaaaa;
  QGestureEvent::gestures(event);
  local_1a0.d = (Data *)0x0;
  local_88[0].xp = 0.0;
  QVar15 = QWidget::mapFromGlobal(pQVar14,(QPoint *)local_88);
  pqVar31 = (qreal *)&DAT_006f3c60;
  pQVar32 = local_88;
  for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
    (*(qreal (*) [3])&pQVar32->xp)[0] = *pqVar31;
    pqVar31 = pqVar31 + (ulong)bVar42 * -2 + 1;
    pQVar32 = (QPointF *)&pQVar32[-(ulong)bVar42].yp;
  }
  QTransform::fromTranslate((double)QVar15.xp.m_i.m_i,(double)QVar15.yp.m_i.m_i);
  QGraphicsView::viewportTransform(&local_178,this_01);
  QTransform::inverted((bool *)local_128);
  QTransform::operator*((QTransform *)local_88,&local_d8);
  puVar7 = puStack_190;
  if (local_188 != (undefined1 *)0x0) {
    lVar24 = (long)local_188 << 3;
    lVar35 = 0;
    do {
      local_128[0].d = *(Data **)(puVar7 + lVar35);
      bVar8 = QGesture::hasHotSpot((QGesture *)local_128[0].d);
      if (bVar8) {
        QVar44 = QGesture::hotSpot((QGesture *)local_128[0].d);
        ppQVar43 = (QGraphicsObject **)QVar44.yp;
        local_d8.m_matrix[0][0] = QVar44.xp;
        local_d8.m_matrix[0][1] = (qreal)ppQVar43;
        uVar6 = QTransform::map(local_88);
        lVar3 = *(long *)((long)local_128[0].d + 8);
        *(undefined8 *)(lVar3 + 0x90) = uVar6;
        *(QGraphicsObject ***)(lVar3 + 0x98) = ppQVar43;
      }
      else {
        lVar3 = *(long *)((long)local_128[0].d + 8);
        *(undefined8 *)(lVar3 + 0x90) = 0;
        *(undefined8 *)(lVar3 + 0x98) = 0;
      }
      pDVar33 = (this->gestureTargets).d;
      if ((((pDVar33 == (Data *)0x0) ||
           (pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                      findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                          pDVar33,(QGesture **)local_128),
           pNVar16 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) ||
          (pNVar16->value == (QGraphicsObject *)0x0)) &&
         (GVar10 = QGesture::state((QGesture *)local_128[0].d), GVar10 == GestureStarted)) {
        local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)&local_1a0,(QGesture **)&local_d8,
                   (QHashDummyValue *)&local_178);
      }
      lVar35 = lVar35 + 8;
    } while (lVar24 != lVar35);
  }
  if ((local_1a0.d != (Data *)0x0) && ((local_1a0.d)->size != 0)) {
    local_178.m_matrix[0][0] = 0.0;
    local_1a8.d = (Data *)0x0;
    pQVar2 = &this->cachedItemGestures;
    gestureTargetsAtHotSpots
              (this,(QSet<QGesture_*> *)&local_1a0,0,pQVar2,(QSet<QGraphicsObject_*> *)0x0,
               (QSet<QGesture_*> *)&local_178,(QSet<QGesture_*> *)&local_1a8);
    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::keys((QList<QGraphicsObject_*> *)&local_d8,pQVar2);
    pQVar37 = &this->cachedTargetItems;
    QArrayDataPointer<QGraphicsObject_*>::operator=
              (&pQVar37->d,(QArrayDataPointer<QGraphicsObject_*> *)&local_d8);
    if ((Data *)local_d8.m_matrix[0][0] != (Data *)0x0) {
      LOCK();
      *(int *)local_d8.m_matrix[0][0] = *(int *)local_d8.m_matrix[0][0] + -1;
      UNLOCK();
      if (*(int *)local_d8.m_matrix[0][0] == 0) {
        QArrayData::deallocate((QArrayData *)local_d8.m_matrix[0][0],8,0x10);
      }
    }
    iVar17 = QList<QGraphicsObject_*>::begin(pQVar37);
    iVar18 = QList<QGraphicsObject_*>::end(pQVar37);
    if (iVar17.i != iVar18.i) {
      uVar19 = (long)iVar18.i - (long)iVar17.i >> 3;
      lVar24 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar24 == 0; lVar24 = lVar24 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsObject*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (iVar17,iVar18,(ulong)(((uint)lVar24 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ec7d9);
      std::
      __final_insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (iVar17,iVar18,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ec7d9);
    }
    if (((local_1a8.d != (Data *)0x0) && ((local_1a8.d)->size != 0)) &&
       ((this->cachedTargetItems).d.size != 0)) {
      this_02 = &this->gestureTargets;
      uVar19 = 0;
      do {
        pDVar4 = (Data *)(this->cachedTargetItems).d.ptr[uVar19];
        if ((pDVar4 == (Data *)0x0) ||
           (local_210 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar4),
           local_210 == (int *)0x0)) {
          bVar8 = true;
          local_210 = (int *)0x0;
          local_128[0].d = (Data *)(Data *)0x0;
        }
        else {
          bVar8 = false;
          local_128[0].d = (Data *)pDVar4;
          if (local_210[1] == 0) {
            local_128[0].d = (Data *)(Data *)0x0;
          }
        }
        local_1b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)&local_d8,
                   (QGraphicsObject **)pQVar2);
        operator&((QSet<QGesture_*> *)&local_1b0,(QSet<QGesture_*> *)&local_1a8);
        QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_d8);
        iVar34 = 6;
        if ((local_1b0.d != (Data *)0x0) && ((local_1b0.d)->size != 0)) {
          local_d8.m_matrix[2][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[2][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[1][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[1][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[1][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QSet<QGesture_*>::values((QList<QGesture_*> *)local_128,(QSet<QGesture_*> *)&local_1b0);
          QGestureEvent::QGestureEvent((QGestureEvent *)&local_d8,(QList<QGesture_*> *)local_128);
          if ((Data *)local_128[0].d != (Data *)0x0) {
            LOCK();
            *(int *)&(local_128[0].d)->super_QArrayData =
                 *(int *)&(local_128[0].d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_128[0].d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_128[0].d)->super_QArrayData,8,0x10);
            }
          }
          local_d8.m_matrix[0][1] = (qreal)CONCAT62(local_d8.m_matrix[0][1]._2_6_,0xca);
          pQVar14 = QGestureEvent::widget(event);
          QGestureEvent::setWidget((QGestureEvent *)&local_d8,pQVar14);
          local_d8.m_matrix[0][1]._0_5_ = (uint5)local_d8.m_matrix[0][1]._0_4_;
          if (local_1b0.d == (Data *)0x0) {
LAB_006077c1:
            uVar38 = 0;
            QVar27.d = (Data *)0x0;
LAB_006077c6:
            if (uVar38 != 0 || QVar27.d != (Data *)0x0) goto LAB_006077ce;
          }
          else {
            QVar27.d = local_1b0.d;
            if ((local_1b0.d)->spans->offsets[0] == 0xff) {
              uVar30 = 1;
              do {
                uVar38 = uVar30;
                if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                    (_func_int **)uVar38) goto LAB_006077c1;
                uVar30 = uVar38 + 1;
              } while ((local_1b0.d)->spans[uVar38 >> 7].offsets[(uint)uVar38 & 0x7f] == 0xff);
              goto LAB_006077c6;
            }
            uVar38 = 0;
LAB_006077ce:
            do {
              QGestureEvent::setAccepted
                        ((QGestureEvent *)&local_d8,
                         *(QGesture **)
                          (*(long *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 + 0x80) +
                          (ulong)*(byte *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                                          (ulong)((uint)uVar38 & 0x7f)) * 8),false);
              do {
                if ((long)((QGraphicsItem *)&(QVar27.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                    uVar38) {
                  uVar38 = 0;
                  QVar27.d = (Data *)0x0;
                  break;
                }
                uVar38 = uVar38 + 1;
              } while (*(char *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                                (ulong)((uint)uVar38 & 0x7f)) == -1);
            } while ((uVar38 != 0) || (QVar27.d != (Data *)0x0));
          }
          if (bVar8) {
            pDVar28 = (Data *)0x0;
          }
          else {
            pDVar28 = pDVar4;
            if (local_210[1] == 0) {
              pDVar28 = (Data *)0x0;
            }
          }
          pQVar23 = (QGraphicsItem *)&pDVar28->numBuckets;
          if (pDVar28 == (Data *)0x0) {
            pQVar23 = (QGraphicsItem *)0x0;
          }
          sendEvent(this,pQVar23,(QEvent *)&local_d8);
          if (local_1b0.d == (Data *)0x0) {
LAB_006078cf:
            uVar38 = 0;
            QVar27.d = (Data *)0x0;
LAB_006078d4:
            if (uVar38 != 0 || QVar27.d != (Data *)0x0) goto LAB_006078e0;
          }
          else {
            QVar27.d = local_1b0.d;
            if ((local_1b0.d)->spans->offsets[0] == 0xff) {
              uVar30 = 1;
              do {
                uVar38 = uVar30;
                if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                    (_func_int **)uVar38) goto LAB_006078cf;
                uVar30 = uVar38 + 1;
              } while ((local_1b0.d)->spans[uVar38 >> 7].offsets[(uint)uVar38 & 0x7f] == 0xff);
              goto LAB_006078d4;
            }
            uVar38 = 0;
LAB_006078e0:
            do {
              local_1b8.d = *(Data **)(*(long *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90
                                                + 0x80) +
                                      (ulong)*(byte *)(*(long *)&(QVar27.d)->spans +
                                                       (uVar38 >> 7) * 0x90 +
                                                      (ulong)((uint)uVar38 & 0x7f)) * 8);
              if ((local_d8.m_matrix[0][1]._4_1_ != '\0') ||
                 (bVar9 = QGestureEvent::isAccepted
                                    ((QGestureEvent *)&local_d8,(QGesture *)local_1b8.d), bVar9)) {
                QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                          ((QHash<QGesture*,QHashDummyValue> *)&local_1a8,(QGesture **)&local_1b8);
                if (!bVar8) {
                  if ((pDVar4 != (Data *)0x0) && (local_210[1] != 0)) {
                    local_1c0.d = pDVar4;
                    if (local_210[1] == 0) {
                      local_1c0.d = (Data *)0x0;
                    }
                    local_128[0].d = (Data *)local_1b8.d;
                    QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                              ((QHash<QGesture*,QGraphicsObject*> *)this_02,(QGesture **)local_128,
                               (QGraphicsObject **)&local_1c0);
                    d = pQVar2->d;
                    if (d == (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0)
                    {
LAB_00607a1b:
                      d = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0;
                      uVar29 = 0;
LAB_00607a20:
                      if (uVar29 != 0 ||
                          d != (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                               0x0) goto LAB_00607a28;
                    }
                    else {
                      if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
                        d = QHashPrivate::
                            Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_>::
                            detached(d);
                        pQVar2->d = d;
                      }
                      if (d->spans->offsets[0] == 0xff) {
                        uVar30 = 1;
                        do {
                          uVar29 = uVar30;
                          if (d->numBuckets == uVar29) goto LAB_00607a1b;
                          uVar30 = uVar29 + 1;
                        } while (d->spans[uVar29 >> 7].offsets[(uint)uVar29 & 0x7f] == 0xff);
                        goto LAB_00607a20;
                      }
                      uVar29 = 0;
LAB_00607a28:
                      do {
                        QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                                  ((QHash<QGesture*,QHashDummyValue> *)
                                   (d->spans[uVar29 >> 7].entries
                                    [d->spans[uVar29 >> 7].offsets[(uint)uVar29 & 0x7f]].storage.
                                    data + 8),(QGesture **)&local_1b8);
                        do {
                          if (d->numBuckets - 1 == uVar29) {
                            uVar29 = 0;
                            d = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                                0x0;
                            break;
                          }
                          uVar29 = uVar29 + 1;
                        } while (d->spans[uVar29 >> 7].offsets[(uint)uVar29 & 0x7f] == 0xff);
                      } while ((uVar29 != 0) ||
                              (d != (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_>
                                     *)0x0));
                    }
                    local_1c0.d = pDVar4;
                    if (local_210[1] == 0) {
                      local_1c0.d = (Data *)0x0;
                    }
                    QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                              ((TryEmplaceResult *)local_128,
                               (QHash<QGraphicsObject*,QSet<QGesture*>> *)pQVar2,
                               (QGraphicsObject **)&local_1c0);
                    pQVar1 = (QObject *)((long)local_128[0].d + 0x20);
                    lVar24 = ((ulong)local_128[0].ptr >> 7) * 0x90;
                    local_128[0].d = (Data *)local_1b8.d;
                    QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                              ((QHash<QGesture*,QHashDummyValue> *)
                               (*(long *)(*(long *)pQVar1 + 0x80 + lVar24) +
                                (ulong)*(byte *)((ulong)((uint)local_128[0].ptr & 0x7f) +
                                                *(long *)pQVar1 + lVar24) * 0x10 + 8),
                               (QGesture **)local_128,(QHashDummyValue *)&local_1c8);
                    goto LAB_00607b39;
                  }
                  pDVar33 = this_02->d;
                  if (pDVar33 == (Data *)0x0) goto LAB_00607b5e;
                  goto LAB_00607b41;
                }
                if (this_02->d != (Data *)0x0) {
                  QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                  findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                      this_02->d,(QGesture **)&local_1b8);
                }
              }
              else {
LAB_00607b39:
                pDVar33 = this_02->d;
                if (pDVar33 == (Data *)0x0) {
                  if (bVar8) goto LAB_00607bac;
                }
                else {
LAB_00607b41:
                  pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                            findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>
                                                 *)pDVar33,(QGesture **)&local_1b8);
                  if (pNVar16 != (Node<QGesture_*,_QGraphicsObject_*> *)0x0 || bVar8)
                  goto LAB_00607bac;
                }
LAB_00607b5e:
                if ((pDVar4 != (Data *)0x0) && (local_210[1] != 0)) {
                  local_1c0.d = pDVar4;
                  if (local_210[1] == 0) {
                    local_1c0.d = (Data *)0x0;
                  }
                  local_128[0].d = (Data *)local_1b8.d;
                  QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                            ((QHash<QGesture*,QGraphicsObject*> *)this_02,(QGesture **)local_128,
                             (QGraphicsObject **)&local_1c0);
                }
              }
LAB_00607bac:
              do {
                if ((long)((QGraphicsItem *)&(QVar27.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                    uVar38) {
                  uVar38 = 0;
                  QVar27.d = (Data *)0x0;
                  break;
                }
                uVar38 = uVar38 + 1;
              } while (*(char *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                                (ulong)((uint)uVar38 & 0x7f)) == -1);
            } while ((uVar38 != 0) || (QVar27.d != (Data *)0x0));
          }
          if ((local_1a8.d == (Data *)0x0) || (iVar34 = 0, (local_1a8.d)->size == 0)) {
            iVar34 = 4;
          }
          QGestureEvent::~QGestureEvent((QGestureEvent *)&local_d8);
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1b0)
        ;
        if (!bVar8) {
          LOCK();
          *local_210 = *local_210 + -1;
          UNLOCK();
          if (*local_210 == 0) {
            operator_delete(local_210);
          }
        }
      } while (((iVar34 == 6) || (iVar34 == 0)) &&
              (uVar19 = uVar19 + 1, uVar19 < (ulong)(this->cachedTargetItems).d.size));
    }
    if (((local_178.m_matrix[0][0] != 0.0) && (*(long *)((long)local_178.m_matrix[0][0] + 8) != 0))
       && ((this->cachedTargetItems).d.size != 0)) {
      uVar19 = 0;
      do {
        if ((local_178.m_matrix[0][0] == 0.0) ||
           (*(long *)((long)local_178.m_matrix[0][0] + 8) == 0)) break;
        local_128[0].d = (Data *)(this->cachedTargetItems).d.ptr[uVar19];
        local_1b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value(&local_1b0,(QGraphicsObject **)pQVar2);
        if (local_1b0.d == (Data *)0x0) {
LAB_00607d4f:
          uVar38 = 0;
          QVar27.d = (Data *)0x0;
LAB_00607d54:
          if (uVar38 != 0 || QVar27.d != (Data *)0x0) goto LAB_00607d60;
        }
        else {
          QVar27.d = local_1b0.d;
          if ((local_1b0.d)->spans->offsets[0] == 0xff) {
            uVar30 = 1;
            do {
              uVar38 = uVar30;
              if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                  (_func_int **)uVar38) goto LAB_00607d4f;
              uVar30 = uVar38 + 1;
            } while ((local_1b0.d)->spans[uVar38 >> 7].offsets[(uint)uVar38 & 0x7f] == 0xff);
            goto LAB_00607d54;
          }
          uVar38 = 0;
LAB_00607d60:
          do {
            local_1b8.d = *(Data **)(*(long *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                                              0x80) +
                                    (ulong)*(byte *)(*(long *)&(QVar27.d)->spans +
                                                     (uVar38 >> 7) * 0x90 +
                                                    (ulong)((uint)uVar38 & 0x7f)) * 8);
            pDVar33 = (this->gestureTargets).d;
            if ((pDVar33 == (Data *)0x0) ||
               (pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                          findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>
                                               *)pDVar33,(QGesture **)&local_1b8),
               pNVar16 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
              local_d8.m_matrix[0][0] = (qreal)local_1b8.d;
              QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                        ((QHash<QGesture*,QGraphicsObject*> *)&this->gestureTargets,
                         (QGesture **)&local_d8,(QGraphicsObject **)local_128);
              QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)&local_178,(QGesture **)&local_1b8);
            }
            do {
              if ((long)((QGraphicsItem *)&(QVar27.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                  uVar38) {
                uVar38 = 0;
                QVar27.d = (Data *)0x0;
                break;
              }
              uVar38 = uVar38 + 1;
            } while (*(char *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                              (ulong)((uint)uVar38 & 0x7f)) == -1);
          } while ((uVar38 != 0) || (QVar27.d != (Data *)0x0));
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1b0)
        ;
        uVar19 = uVar19 + 1;
      } while (uVar19 < (ulong)(this->cachedTargetItems).d.size);
    }
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a8);
    QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_178);
  }
  puVar7 = puStack_190;
  local_178.m_matrix[0][0] = 0.0;
  local_1a8.d = (Data *)0x0;
  if (local_188 != (undefined1 *)0x0) {
    lVar24 = (long)local_188 << 3;
    lVar35 = 0;
    do {
      local_128[0].d = *(Data **)(puVar7 + lVar35);
      pDVar33 = (this->gestureTargets).d;
      if (((pDVar33 != (Data *)0x0) &&
          (pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                     findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                         pDVar33,(QGesture **)local_128),
          pNVar16 != (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) &&
         (local_1b0.d = (Data *)pNVar16->value, local_1b0.d != (Data *)0x0)) {
        QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                  ((TryEmplaceResult *)&local_d8,
                   (QHash<QGraphicsObject*,QSet<QGesture*>> *)&this->cachedItemGestures,
                   (QGraphicsObject **)&local_1b0);
        pQVar1 = (QObject *)((long)local_d8.m_matrix[0][0] + 0x20);
        local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)
                   (*(long *)(*(long *)pQVar1 + ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 + 0x80)
                   + ((ulong)*(byte *)(*(long *)pQVar1 +
                                       ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 +
                                      (ulong)(SUB84(local_d8.m_matrix[0][1],0) & 0x7f)) * 2 + 1) * 8
                   ),(QGesture **)&local_d8,(QHashDummyValue *)&local_1b8);
        local_d8.m_matrix[0][0] = (qreal)local_1b0.d;
        QtPrivate::QPodArrayOps<QGraphicsObject*>::emplace<QGraphicsObject*&>
                  ((QPodArrayOps<QGraphicsObject*> *)&this->cachedTargetItems,
                   (this->cachedTargetItems).d.size,(QGraphicsObject **)&local_d8);
        QList<QGraphicsObject_*>::end(&this->cachedTargetItems);
        local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)&local_178,(QGesture **)&local_d8,
                   (QHashDummyValue *)&local_1b8);
        QVar5.d = ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&(local_1b0.d)->seed)->d;
        GVar11 = QGesture::gestureType((QGesture *)local_128[0].d);
        local_d8.m_matrix[0][0] = (qreal)CONCAT44(local_d8.m_matrix[0][0]._4_4_,GVar11);
        local_1b8.d = local_1b8.d & 0xffffffff00000000;
        QVar12 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::value
                           (&(QVar5.d)->gestureContext,(GestureType *)&local_d8,
                            (QFlags<Qt::GestureFlag> *)&local_1b8);
        if (((uint)QVar12.super_QFlagsStorageHelper<Qt::GestureFlag,_4>.
                   super_QFlagsStorage<Qt::GestureFlag>.i & 4) != 0) {
          local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
          QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QGesture*,QHashDummyValue> *)&local_1a8,(QGesture **)&local_d8,
                     (QHashDummyValue *)&local_1b8);
        }
      }
      lVar35 = lVar35 + 8;
    } while (lVar24 != lVar35);
  }
  pQVar37 = &this->cachedTargetItems;
  iVar17 = QList<QGraphicsObject_*>::begin(pQVar37);
  iVar18 = QList<QGraphicsObject_*>::end(pQVar37);
  if (iVar17.i != iVar18.i) {
    uVar19 = (long)iVar18.i - (long)iVar17.i >> 3;
    lVar24 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QGraphicsObject*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (iVar17,iVar18,(ulong)(((uint)lVar24 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ec7d9);
    std::
    __final_insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (iVar17,iVar18,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ec7d9);
  }
  if ((this->cachedTargetItems).d.size != 0) {
    pQVar2 = &this->cachedItemGestures;
    lVar24 = 0;
    iVar34 = 0;
    do {
      pDVar4 = (Data *)(this->cachedTargetItems).d.ptr[lVar24];
      if ((pDVar4 == (Data *)0x0) ||
         (piVar20 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar4),
         piVar20 == (int *)0x0)) {
        pDVar28 = (Data *)0x1;
        piVar20 = (int *)0x0;
        local_1b8.d = (Data *)(Data *)0x0;
      }
      else {
        pDVar28 = (Data *)0x0;
        local_1b8.d = (Data *)pDVar4;
        if (piVar20[1] == 0) {
          local_1b8.d = (Data *)pDVar28;
        }
      }
      local_1b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)local_128,(QGraphicsObject **)pQVar2
                );
      operator&((QSet<QGesture_*> *)&local_d8,(QSet<QGesture_*> *)&local_178);
      cVar36 = (char)pDVar28;
      if (cVar36 == '\0') {
        local_1c8 = pDVar4;
        if (piVar20[1] == 0) {
          local_1c8 = (Data *)0x0;
        }
      }
      else {
        local_1c8 = (Data *)0x0;
      }
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                (&local_1c0,(QGraphicsObject **)&this->cachedAlreadyDeliveredGestures);
      operator-((QSet<QGesture_*> *)&local_1b0,(QSet<QGesture_*> *)&local_d8);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1c0);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_d8);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)local_128);
      iVar25 = 0x17;
      if ((local_1b0.d != (Data *)0x0) && ((local_1b0.d)->size != 0)) {
        if (cVar36 == '\0') {
          local_128[0].d = (Data *)pDVar4;
          if (piVar20[1] == 0) {
            local_128[0].d = (Data *)0x0;
          }
        }
        else {
          local_128[0].d = (Data *)(Data *)0x0;
        }
        QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                  ((TryEmplaceResult *)&local_d8,
                   (QHash<QGraphicsObject*,QSet<QGesture*>> *)&this->cachedAlreadyDeliveredGestures,
                   (QGraphicsObject **)local_128);
        lVar24 = *(long *)(*(long *)((long)local_d8.m_matrix[0][0] + 0x20) +
                           ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 + 0x80);
        uVar19 = (ulong)*(byte *)(*(long *)((long)local_d8.m_matrix[0][0] + 0x20) +
                                  ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 +
                                 (ulong)(SUB84(local_d8.m_matrix[0][1],0) & 0x7f));
        if (*(Data **)(lVar24 + (uVar19 * 2 + 1) * 8) != local_1b0.d) {
          if (local_1b0.d == (Data *)0x0) {
LAB_006082de:
            uVar38 = 0;
            QVar27.d = (Data *)0x0;
LAB_006082e2:
            if (QVar27.d == (Data *)0x0 && uVar38 == 0) goto LAB_00608384;
          }
          else {
            QVar27.d = local_1b0.d;
            if ((local_1b0.d)->spans->offsets[0] == 0xff) {
              uVar30 = 1;
              do {
                uVar38 = uVar30;
                if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                    (_func_int **)uVar38) goto LAB_006082de;
                uVar30 = uVar38 + 1;
              } while ((local_1b0.d)->spans[uVar38 >> 7].offsets[(uint)uVar38 & 0x7f] == 0xff);
              goto LAB_006082e2;
            }
            uVar38 = 0;
          }
          do {
            local_d8.m_matrix[0][0] =
                 *(qreal *)(*(long *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 + 0x80) +
                           (ulong)*(byte *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                                           (ulong)((uint)uVar38 & 0x7f)) * 8);
            QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                      ((QHash<QGesture*,QHashDummyValue> *)(lVar24 + (uVar19 * 2 + 1) * 8),
                       (QGesture **)&local_d8,(QHashDummyValue *)&local_1b8);
            do {
              if ((long)((QGraphicsItem *)&(QVar27.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                  uVar38) {
                uVar38 = 0;
                QVar27.d = (Data *)0x0;
                break;
              }
              uVar38 = uVar38 + 1;
            } while (*(char *)(*(long *)&(QVar27.d)->spans + (uVar38 >> 7) * 0x90 +
                              (ulong)((uint)uVar38 & 0x7f)) == -1);
          } while ((uVar38 != 0) || (QVar27.d != (Data *)0x0));
        }
LAB_00608384:
        bVar8 = QGraphicsItem::isPanel((QGraphicsItem *)&pDVar4->numBuckets);
        local_d8.m_matrix[2][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[2][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[1][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[1][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[1][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QSet<QGesture_*>::values((QList<QGesture_*> *)local_128,(QSet<QGesture_*> *)&local_1b0);
        QGestureEvent::QGestureEvent((QGestureEvent *)&local_d8,(QList<QGesture_*> *)local_128);
        if ((Data *)local_128[0].d != (Data *)0x0) {
          LOCK();
          *(int *)&(local_128[0].d)->super_QArrayData =
               *(int *)&(local_128[0].d)->super_QArrayData + -1;
          UNLOCK();
          if (*(int *)&(local_128[0].d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_128[0].d)->super_QArrayData,8,0x10);
          }
        }
        pQVar14 = QGestureEvent::widget(event);
        QGestureEvent::setWidget((QGestureEvent *)&local_d8,pQVar14);
        if (cVar36 == '\0') {
          pDVar28 = pDVar4;
          if (piVar20[1] == 0) {
            pDVar28 = (Data *)0x0;
          }
        }
        else {
          pDVar28 = (Data *)0x0;
        }
        pQVar23 = (QGraphicsItem *)&pDVar28->numBuckets;
        if (pDVar28 == (Data *)0x0) {
          pQVar23 = (QGraphicsItem *)0x0;
        }
        sendEvent(this,pQVar23,(QEvent *)&local_d8);
        local_1b8.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
        if (local_1b0.d == (Data *)0x0) {
LAB_006084c9:
          uVar30 = 0;
          QVar27.d = (Data *)0x0;
LAB_006084ce:
          if (QVar27.d != (Data *)0x0 || uVar30 != 0) goto LAB_0060861b;
        }
        else {
          QVar27.d = local_1b0.d;
          if ((local_1b0.d)->spans->offsets[0] == 0xff) {
            uVar19 = 1;
            do {
              uVar30 = uVar19;
              if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                  (_func_int **)uVar30) goto LAB_006084c9;
              uVar19 = uVar30 + 1;
            } while ((local_1b0.d)->spans[uVar30 >> 7].offsets[(uint)uVar30 & 0x7f] == 0xff);
            goto LAB_006084ce;
          }
          uVar30 = 0;
LAB_0060861b:
          do {
            local_1c0.d = *(Data **)(*(long *)(*(long *)&(QVar27.d)->spans + (uVar30 >> 7) * 0x90 +
                                              0x80) +
                                    (ulong)*(byte *)(*(long *)&(QVar27.d)->spans +
                                                     (uVar30 >> 7) * 0x90 +
                                                    (ulong)((uint)uVar30 & 0x7f)) * 8);
            if ((local_d8.m_matrix[0][1]._4_1_ != '\0') ||
               (bVar9 = QGestureEvent::isAccepted
                                  ((QGestureEvent *)&local_d8,(QGesture *)local_1c0.d), bVar9)) {
              if ((cVar36 == '\0') &&
                 (((pDVar4 != (Data *)0x0 && (piVar20[1] != 0)) &&
                  (GVar10 = QGesture::state((QGesture *)local_1c0.d), GVar10 == GestureStarted)))) {
                pDVar28 = pDVar4;
                if (piVar20[1] == 0) {
                  pDVar28 = (Data *)0x0;
                }
                QHash<QGesture*,QGraphicsObject*>::tryEmplace_impl<QGesture*const&>
                          ((TryEmplaceResult *)local_128,
                           (QHash<QGesture*,QGraphicsObject*> *)&this->gestureTargets,
                           (QGesture **)&local_1c0);
                *(Data **)(*(long *)(*(long *)((long)local_128[0].d + 0x20) +
                                     ((ulong)local_128[0].ptr >> 7) * 0x90 + 0x80) +
                          ((ulong)*(byte *)(*(long *)((long)local_128[0].d + 0x20) +
                                            ((ulong)local_128[0].ptr >> 7) * 0x90 +
                                           (ulong)((uint)local_128[0].ptr & 0x7f)) * 2 + 1) * 8) =
                     pDVar28;
              }
              QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)&local_178,(QGesture **)&local_1c0);
            }
            else if (((cVar36 == '\0') && (pDVar4 != (Data *)0x0)) && (piVar20[1] != 0)) {
              pDVar28 = pDVar4;
              if (piVar20[1] == 0) {
                pDVar28 = (Data *)0x0;
              }
              pDVar33 = (this->gestureTargets).d;
              pDVar21 = (Data *)0x0;
              if (pDVar33 != (Data *)0x0) {
                pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                          findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>
                                               *)pDVar33,(QGesture **)&local_1c0);
                if (pNVar16 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0) {
                  pDVar21 = (Data *)0x0;
                }
                else {
                  pDVar21 = (Data *)pNVar16->value;
                }
              }
              if (pDVar28 == pDVar21) {
                local_128[0].d = (Data *)local_1c0.d;
                QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                          ((QHash<QGesture*,QHashDummyValue> *)&local_1b8,(QGesture **)local_128,
                           (QHashDummyValue *)&local_1c8);
              }
            }
            do {
              if ((long)((QGraphicsItem *)&(QVar27.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                  uVar30) {
                QVar27.d = (Data *)0x0;
                uVar30 = 0;
                break;
              }
              uVar30 = uVar30 + 1;
            } while (*(char *)(*(long *)&(QVar27.d)->spans + (uVar30 >> 7) * 0x90 +
                              (ulong)((uint)uVar30 & 0x7f)) == -1);
          } while ((QVar27.d != (Data *)0x0) || (uVar30 != 0));
        }
        iVar25 = 0x15;
        if ((local_178.m_matrix[0][0] != 0.0) &&
           (((*(long *)((long)local_178.m_matrix[0][0] + 8) != 0 &&
             (iVar25 = 0,
             local_1b8.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0)) &&
            (!bVar8 && (local_1b8.d)->size != 0)))) {
          ppQVar43 = (this->cachedTargetItems).d.ptr;
          lVar24 = (this->cachedTargetItems).d.size;
          local_1c0.d = (Data *)0x0;
          QHash<QGraphicsObject_*,_QHashDummyValue>::reserve
                    ((QHash<QGraphicsObject_*,_QHashDummyValue> *)&local_1c0,lVar24);
          if (lVar24 != 0) {
            lVar35 = 0;
            do {
              local_128[0].d = *(Data **)((long)ppQVar43 + lVar35);
              QHash<QGraphicsObject*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                        ((QHash<QGraphicsObject*,QHashDummyValue> *)&local_1c0,
                         (QGraphicsObject **)local_128,(QHashDummyValue *)&local_1c8);
              lVar35 = lVar35 + 8;
            } while (lVar24 << 3 != lVar35);
          }
          if (((cVar36 == '\0') && (pDVar4 != (Data *)0x0)) && (piVar20[1] != 0)) {
            if (local_1b8.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
LAB_00608883:
              sVar41 = 0;
              QVar40.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_00608889:
              it.bucket = sVar41;
              it.d = QVar40.d;
              if (QVar40.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
                  sVar41 == 0) goto LAB_00608a68;
            }
            else {
              if (1 < (uint)((local_1b8.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
                local_1b8.d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::
                              detached(local_1b8.d);
              }
              if ((local_1b8.d)->spans->offsets[0] == 0xff) {
                uVar19 = 1;
                do {
                  sVar41 = uVar19;
                  if ((local_1b8.d)->numBuckets == sVar41) goto LAB_00608883;
                  QVar40.d = local_1b8.d;
                  uVar19 = sVar41 + 1;
                } while ((local_1b8.d)->spans[sVar41 >> 7].offsets[(uint)sVar41 & 0x7f] == 0xff);
                goto LAB_00608889;
              }
              it.bucket = 0;
              it.d = local_1b8.d;
            }
            do {
              uVar19 = it.bucket;
              pDVar39 = it.d;
              if (local_1a8.d == (Data *)0x0) {
LAB_00608a20:
                do {
                  if (pDVar39->numBuckets - 1 == uVar19) {
                    it = (piter)ZEXT816(0);
                    break;
                  }
                  uVar19 = uVar19 + 1;
                  it.bucket = uVar19;
                  it.d = pDVar39;
                } while (pDVar39->spans[uVar19 >> 7].offsets[(uint)uVar19 & 0x7f] == 0xff);
              }
              else {
                uVar30 = uVar19 >> 7;
                uVar26 = (uint)it.bucket & 0x7f;
                pNVar22 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>::
                          findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QHashDummyValue>> *
                                              )local_1a8.d,
                                              (QGesture **)
                                              (pDVar39->spans[uVar30].entries +
                                              pDVar39->spans[uVar30].offsets[uVar26]));
                if (pNVar22 == (Node<QGesture_*,_QHashDummyValue> *)0x0) goto LAB_00608a20;
                pDVar28 = *(Data **)pDVar39->spans[uVar30].entries
                                    [pDVar39->spans[uVar30].offsets[uVar26]].storage.data;
                local_1cc = QGesture::gestureType((QGesture *)pDVar28);
                pQVar23 = (QGraphicsItem *)&pDVar4->numBuckets;
                if (piVar20[1] != 0) {
                  do {
                    local_1c8 = (Data *)QGraphicsItem::toGraphicsObject(pQVar23);
                    if ((local_1c8 != (Data *)0x0) &&
                       (bVar8 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                          (&((pQVar23->d_ptr).d)->gestureContext,&local_1cc), bVar8)
                       ) {
                      local_128[0].d = (Data *)local_1c8;
                      QHash<QGraphicsObject*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                                ((QHash<QGraphicsObject*,QHashDummyValue> *)&local_1c0,
                                 (QGraphicsObject **)local_128,&local_179);
                      QHash<QGraphicsObject*,QSet<QGesture*>>::
                      tryEmplace_impl<QGraphicsObject*const&>
                                ((TryEmplaceResult *)local_128,
                                 (QHash<QGraphicsObject*,QSet<QGesture*>> *)pQVar2,
                                 (QGraphicsObject **)&local_1c8);
                      pQVar1 = (QObject *)((long)local_128[0].d + 0x20);
                      lVar24 = ((ulong)local_128[0].ptr >> 7) * 0x90;
                      local_128[0].d = (Data *)pDVar28;
                      QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                                ((QHash<QGesture*,QHashDummyValue> *)
                                 (*(long *)(*(long *)pQVar1 + 0x80 + lVar24) +
                                  (ulong)*(byte *)((ulong)((uint)local_128[0].ptr & 0x7f) +
                                                  *(long *)pQVar1 + lVar24) * 0x10 + 8),
                                 (QGesture **)local_128,&local_179);
                    }
                    bVar8 = QGraphicsItem::isPanel(pQVar23);
                  } while ((!bVar8) &&
                          (pQVar23 = QGraphicsItem::parentItem(pQVar23),
                          pQVar23 != (QGraphicsItem *)0x0));
                }
                it = (piter)QHash<QGesture_*,_QHashDummyValue>::erase(&local_1b8,(const_iterator)it)
                ;
              }
            } while ((it.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) ||
                    (it.bucket != 0));
          }
LAB_00608a68:
          gestureTargetsAtHotSpots
                    (this,(QSet<QGesture_*> *)&local_1b8,ReceivePartialGestures,pQVar2,
                     (QSet<QGraphicsObject_*> *)&local_1c0,(QSet<QGesture_*> *)0x0,
                     (QSet<QGesture_*> *)0x0);
          QSet<QGraphicsObject_*>::values
                    ((QList<QGraphicsObject_*> *)local_128,(QSet<QGraphicsObject_*> *)&local_1c0);
          QArrayDataPointer<QGraphicsObject_*>::operator=(&pQVar37->d,local_128);
          if ((Data *)local_128[0].d != (Data *)0x0) {
            LOCK();
            *(int *)&(local_128[0].d)->super_QArrayData =
                 *(int *)&(local_128[0].d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_128[0].d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_128[0].d)->super_QArrayData,8,0x10);
            }
          }
          iVar17 = QList<QGraphicsObject_*>::begin(pQVar37);
          iVar18 = QList<QGraphicsObject_*>::end(pQVar37);
          if (iVar17.i != iVar18.i) {
            uVar19 = (long)iVar18.i - (long)iVar17.i >> 3;
            lVar24 = 0x3f;
            if (uVar19 != 0) {
              for (; uVar19 >> lVar24 == 0; lVar24 = lVar24 + -1) {
              }
            }
            std::
            __introsort_loop<QList<QGraphicsObject*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                      (iVar17,iVar18,(ulong)(((uint)lVar24 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                       0x5ec7d9);
            std::
            __final_insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                      (iVar17,iVar18,
                       (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                       0x5ec7d9);
          }
          QHash<QGraphicsObject_*,_QHashDummyValue>::~QHash
                    ((QHash<QGraphicsObject_*,_QHashDummyValue> *)&local_1c0);
          iVar25 = 0x17;
          iVar34 = -1;
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1b8);
        QGestureEvent::~QGestureEvent((QGestureEvent *)&local_d8);
      }
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1b0);
      if (cVar36 == '\0') {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          operator_delete(piVar20);
        }
      }
      if ((iVar25 != 0x17) && (iVar25 != 0)) break;
      iVar34 = iVar34 + 1;
      lVar24 = (long)iVar34;
    } while (lVar24 < (this->cachedTargetItems).d.size);
  }
  if (local_1a0.d == (Data *)0x0) {
    uVar19 = 0;
    QVar40.d = (Data *)0x0;
LAB_00608bad:
    if (QVar40.d != (Data *)0x0 || uVar19 != 0) goto LAB_00608bb9;
  }
  else {
    QVar40.d = local_1a0.d;
    if ((local_1a0.d)->spans->offsets[0] == 0xff) {
      uVar30 = 1;
      do {
        uVar19 = uVar30;
        if ((local_1a0.d)->numBuckets == uVar19) {
          QVar40.d = (Data *)0x0;
          uVar19 = 0;
          break;
        }
        uVar30 = uVar19 + 1;
      } while ((local_1a0.d)->spans[uVar19 >> 7].offsets[(uint)uVar19 & 0x7f] == 0xff);
      goto LAB_00608bad;
    }
    uVar19 = 0;
LAB_00608bb9:
    do {
      this_00 = *(QGesture **)
                 (QVar40.d)->spans[uVar19 >> 7].entries
                 [(QVar40.d)->spans[uVar19 >> 7].offsets[(uint)uVar19 & 0x7f]].storage.data;
      GVar13 = QGesture::gestureCancelPolicy(this_00);
      if (GVar13 == CancelAllInContext) {
        cancelGesturesForChildren(this,this_00);
      }
      do {
        if ((QVar40.d)->numBuckets - 1 == uVar19) {
          QVar40.d = (Data *)0x0;
          uVar19 = 0;
          break;
        }
        uVar19 = uVar19 + 1;
      } while ((QVar40.d)->spans[uVar19 >> 7].offsets[(uint)uVar19 & 0x7f] == 0xff);
    } while ((QVar40.d != (Data *)0x0) || (uVar19 != 0));
  }
  puVar7 = puStack_190;
  if (local_188 != (undefined1 *)0x0) {
    lVar35 = (long)local_188 << 3;
    lVar24 = 0;
    do {
      local_d8.m_matrix[0][0] = *(qreal *)(puVar7 + lVar24);
      GVar10 = QGesture::state((QGesture *)local_d8.m_matrix[0][0]);
      if (GVar10 - GestureFinished < 2) {
        QHash<QGesture*,QGraphicsObject*>::removeImpl<QGesture*>
                  ((QHash<QGesture*,QGraphicsObject*> *)&this->gestureTargets,(QGesture **)&local_d8
                  );
      }
      lVar24 = lVar24 + 8;
    } while (lVar35 != lVar24);
  }
  QList<QGraphicsObject_*>::clear(pQVar37);
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear(&this->cachedItemGestures);
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear(&this->cachedAlreadyDeliveredGestures);
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a8);
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_178);
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a0);
  if (local_198 != (QArrayData *)0x0) {
    LOCK();
    (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_198,8,0x10);
    }
  }
LAB_00608d1f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::gestureEventHandler(QGestureEvent *event)
{
    QWidget *viewport = event->widget();
    if (!viewport)
        return;
    QGraphicsView *graphicsView = qobject_cast<QGraphicsView *>(viewport->parent());
    if (!graphicsView)
        return;

    const QList<QGesture *> allGestures = event->gestures();
    DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
            << "Gestures:" <<  allGestures;

    QSet<QGesture *> startedGestures;
    QPoint delta = viewport->mapFromGlobal(QPoint());
    QTransform toScene = QTransform::fromTranslate(delta.x(), delta.y())
                         * graphicsView->viewportTransform().inverted();
    for (QGesture *gesture : allGestures) {
        // cache scene coordinates of the hot spot
        if (gesture->hasHotSpot()) {
            gesture->d_func()->sceneHotSpot = toScene.map(gesture->hotSpot());
        } else {
            gesture->d_func()->sceneHotSpot = QPointF();
        }

        QGraphicsObject *target = gestureTargets.value(gesture, 0);
        if (!target) {
            // when we are not in started mode but don't have a target
            // then the only one interested in gesture is the view/scene
            if (gesture->state() == Qt::GestureStarted)
                startedGestures.insert(gesture);
        }
    }

    if (!startedGestures.isEmpty()) {
        QSet<QGesture *> normalGestures; // that have just one target
        QSet<QGesture *> conflictedGestures; // that have multiple possible targets
        gestureTargetsAtHotSpots(startedGestures, Qt::GestureFlag(0), &cachedItemGestures, nullptr,
                                 &normalGestures, &conflictedGestures);
        cachedTargetItems = cachedItemGestures.keys();
        std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "Normal gestures:" << normalGestures
                << "Conflicting gestures:" << conflictedGestures;

        // deliver conflicted gestures as override events AND remember
        // initial gesture targets
        if (!conflictedGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size(); ++i) {
                QPointer<QGraphicsObject> item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const QSet<QGesture *> gestures = conflictedGestures & cachedItemGestures.value(item.data());
                if (gestures.isEmpty())
                    continue;

                DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                        << "delivering override to"
                        << item.data() << gestures;
                // send gesture override
                QGestureEvent ev(gestures.values());
                ev.t = QEvent::GestureOverride;
                ev.setWidget(event->widget());
                // mark event and individual gestures as ignored
                ev.ignore();
                for (QGesture *g : gestures)
                    ev.setAccepted(g, false);
                sendEvent(item.data(), &ev);
                // mark all accepted gestures to deliver them as normal gesture events
                for (QGesture *g : gestures) {
                    if (ev.isAccepted() || ev.isAccepted(g)) {
                        conflictedGestures.remove(g);
                        // mark the item as a gesture target
                        if (item) {
                            gestureTargets.insert(g, item.data());
                            QHash<QGraphicsObject *, QSet<QGesture *> >::iterator it, e;
                            it = cachedItemGestures.begin();
                            e = cachedItemGestures.end();
                            for(; it != e; ++it)
                                it.value().remove(g);
                            cachedItemGestures[item.data()].insert(g);
                        }
                        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                                << "override was accepted:"
                                << g << item.data();
                    }
                    // remember the first item that received the override event
                    // as it most likely become a target if no one else accepts
                    // the override event
                    if (!gestureTargets.contains(g) && item)
                        gestureTargets.insert(g, item.data());

                }
                if (conflictedGestures.isEmpty())
                    break;
            }
        }
        // remember the initial target item for each gesture that was not in
        // the conflicted state.
        if (!normalGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size() && !normalGestures.isEmpty(); ++i) {
                QGraphicsObject *item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const auto gestures = cachedItemGestures.value(item);
                for (QGesture *g : gestures) {
                    if (!gestureTargets.contains(g)) {
                        gestureTargets.insert(g, item);
                        normalGestures.remove(g);
                    }
                }
            }
        }
    }


    // deliver all gesture events
    QSet<QGesture *> undeliveredGestures;
    QSet<QGesture *> parentPropagatedGestures;
    for (QGesture *gesture : allGestures) {
        if (QGraphicsObject *target = gestureTargets.value(gesture, 0)) {
            cachedItemGestures[target].insert(gesture);
            cachedTargetItems.append(target);
            undeliveredGestures.insert(gesture);
            QGraphicsItemPrivate *d = target->QGraphicsItem::d_func();
            const Qt::GestureFlags flags = d->gestureContext.value(gesture->gestureType());
            if (flags & Qt::IgnoredGesturesPropagateToParent)
                parentPropagatedGestures.insert(gesture);
        } else {
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "no target for" << gesture << "at"
                    << gesture->hotSpot() << gesture->d_func()->sceneHotSpot;
        }
    }
    std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
    for (int i = 0; i < cachedTargetItems.size(); ++i) {
        QPointer<QGraphicsObject> receiver = cachedTargetItems.at(i);
        const QSet<QGesture *> gestures = (undeliveredGestures
                                        & cachedItemGestures.value(receiver.data()))
                                        - cachedAlreadyDeliveredGestures.value(receiver.data());

        if (gestures.isEmpty())
            continue;

        cachedAlreadyDeliveredGestures[receiver.data()] += gestures;
        const bool isPanel = receiver.data()->isPanel();

        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "delivering to"
                << receiver.data() << gestures;
        QGestureEvent ev(gestures.values());
        ev.setWidget(event->widget());
        sendEvent(receiver.data(), &ev);
        QSet<QGesture *> ignoredGestures;
        for (QGesture *g : gestures) {
            if (!ev.isAccepted() && !ev.isAccepted(g)) {
                // if the gesture was ignored by its target, we will update the
                // targetItems list with a possible target items (items that
                // want to receive partial gestures).
                // ### won't work if the target was destroyed in the event
                //     we will just stop delivering it.
                if (receiver && receiver.data() == gestureTargets.value(g, 0))
                    ignoredGestures.insert(g);
            } else {
                if (receiver && g->state() == Qt::GestureStarted) {
                    // someone accepted the propagated initial GestureStarted
                    // event, let it be the new target for all following events.
                    gestureTargets[g] = receiver.data();
                }
                undeliveredGestures.remove(g);
            }
        }
        if (undeliveredGestures.isEmpty())
            break;

        // ignoredGestures list is only filled when delivering to the gesture
        // target item, so it is safe to assume item == target.
        if (!ignoredGestures.isEmpty() && !isPanel) {
            // look for new potential targets for gestures that were ignored
            // and should be propagated.

            QSet<QGraphicsObject *> targetsSet(cachedTargetItems.constBegin(), cachedTargetItems.constEnd());

            if (receiver) {
                // first if the gesture should be propagated to parents only
                for (QSet<QGesture *>::iterator it = ignoredGestures.begin();
                     it != ignoredGestures.end();) {
                    if (parentPropagatedGestures.contains(*it)) {
                        QGesture *gesture = *it;
                        const Qt::GestureType gestureType = gesture->gestureType();
                        QGraphicsItem *item = receiver.data();
                        while (item) {
                            if (QGraphicsObject *obj = item->toGraphicsObject()) {
                                if (item->d_func()->gestureContext.contains(gestureType)) {
                                    targetsSet.insert(obj);
                                    cachedItemGestures[obj].insert(gesture);
                                }
                            }
                            if (item->isPanel())
                                break;
                            item = item->parentItem();
                        }

                        it = ignoredGestures.erase(it);
                        continue;
                    }
                    ++it;
                }
            }

            gestureTargetsAtHotSpots(ignoredGestures, Qt::ReceivePartialGestures,
                                     &cachedItemGestures, &targetsSet, nullptr, nullptr);

            cachedTargetItems = targetsSet.values();
            std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "new targets:" << cachedTargetItems;
            i = -1; // start delivery again
            continue;
        }
    }

    for (QGesture *g : std::as_const(startedGestures)) {
        if (g->gestureCancelPolicy() == QGesture::CancelAllInContext) {
            DEBUG() << "lets try to cancel some";
            // find gestures in context in Qt::GestureStarted or Qt::GestureUpdated state and cancel them
            cancelGesturesForChildren(g);
        }
    }

    // forget about targets for gestures that have ended
    for (QGesture *g : allGestures) {
        switch (g->state()) {
        case Qt::GestureFinished:
        case Qt::GestureCanceled:
            gestureTargets.remove(g);
            break;
        default:
            break;
        }
    }

    cachedTargetItems.clear();
    cachedItemGestures.clear();
    cachedAlreadyDeliveredGestures.clear();
}